

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  float *pfVar2;
  int iVar3;
  AccelData *pAVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  int *piVar20;
  undefined8 uVar21;
  size_t sVar22;
  bool bVar23;
  undefined4 in_EAX;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  Geometry *pGVar27;
  _func_int **pp_Var28;
  ulong uVar29;
  undefined4 uVar30;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  ulong uVar32;
  Geometry *pGVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar72;
  float fVar74;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar73;
  uint uVar75;
  float fVar76;
  uint uVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar78;
  uint uVar79;
  float fVar87;
  float fVar89;
  vint4 bi;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar88;
  uint uVar90;
  float fVar91;
  uint uVar92;
  float fVar93;
  undefined1 auVar86 [16];
  float fVar94;
  float fVar97;
  float fVar99;
  vint4 ai;
  undefined1 auVar95 [16];
  float fVar98;
  float fVar100;
  undefined1 auVar96 [16];
  float fVar101;
  float fVar107;
  float fVar108;
  vint4 ai_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  vint4 ai_3;
  float fVar118;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar119;
  float fVar120;
  float fVar126;
  float fVar127;
  vint4 bi_4;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  uint uVar128;
  uint uVar132;
  uint uVar133;
  vint4 bi_3;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  uint uVar134;
  undefined1 auVar131 [16];
  uint uVar135;
  uint uVar139;
  uint uVar140;
  vint4 ai_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  uint uVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  vint<4> octant;
  vint4 bi_9;
  int local_11a8;
  int iStack_11a4;
  int iStack_11a0;
  int iStack_119c;
  RTCIntersectFunctionNArguments local_1198;
  Geometry *local_1168;
  undefined8 local_1160;
  RTCIntersectArguments *local_1158;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1138 [16];
  vfloat<4> fmin;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [8];
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  ai.field_0.i[2] = 0xffffffff;
  ai.field_0.v[0] = 0xffffffffffffffff;
  ai.field_0.i[3] = 0xffffffff;
  auVar80._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar80._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar80._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar80._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar24 = movmskps(in_EAX,auVar80);
  if (uVar24 == 0) {
    return;
  }
  pAVar4 = This->ptr;
  pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)(uVar24 & 0xff);
  fVar142 = *(float *)ray;
  fVar143 = *(float *)(ray + 4);
  fVar144 = *(float *)(ray + 8);
  fVar145 = *(float *)(ray + 0xc);
  fVar146 = *(float *)(ray + 0x10);
  fVar147 = *(float *)(ray + 0x14);
  fVar148 = *(float *)(ray + 0x18);
  fVar149 = *(float *)(ray + 0x1c);
  fVar150 = *(float *)(ray + 0x20);
  fVar151 = *(float *)(ray + 0x24);
  fVar152 = *(float *)(ray + 0x28);
  fVar153 = *(float *)(ray + 0x2c);
  auVar95 = *(undefined1 (*) [16])(ray + 0x40);
  fVar110 = (float)DAT_01ff1d40;
  fVar114 = DAT_01ff1d40._4_4_;
  fVar116 = DAT_01ff1d40._8_4_;
  fVar118 = DAT_01ff1d40._12_4_;
  auVar40._4_4_ = -(uint)(ABS(auVar95._4_4_) < fVar114);
  auVar40._0_4_ = -(uint)(ABS(auVar95._0_4_) < fVar110);
  auVar40._8_4_ = -(uint)(ABS(auVar95._8_4_) < fVar116);
  auVar40._12_4_ = -(uint)(ABS(auVar95._12_4_) < fVar118);
  auVar121 = blendvps(auVar95,_DAT_01ff1d40,auVar40);
  auVar40 = *(undefined1 (*) [16])(ray + 0x50);
  auVar129._4_4_ = -(uint)(ABS(auVar40._4_4_) < fVar114);
  auVar129._0_4_ = -(uint)(ABS(auVar40._0_4_) < fVar110);
  auVar129._8_4_ = -(uint)(ABS(auVar40._8_4_) < fVar116);
  auVar129._12_4_ = -(uint)(ABS(auVar40._12_4_) < fVar118);
  auVar129 = blendvps(auVar40,_DAT_01ff1d40,auVar129);
  auVar40 = *(undefined1 (*) [16])(ray + 0x60);
  auVar106._4_4_ = -(uint)(ABS(auVar40._4_4_) < fVar114);
  auVar106._0_4_ = -(uint)(ABS(auVar40._0_4_) < fVar110);
  auVar106._8_4_ = -(uint)(ABS(auVar40._8_4_) < fVar116);
  auVar106._12_4_ = -(uint)(ABS(auVar40._12_4_) < fVar118);
  auVar136 = blendvps(auVar40,_DAT_01ff1d40,auVar106);
  auVar40 = rcpps(auVar106,auVar121);
  fVar156 = auVar40._0_4_;
  fVar157 = auVar40._4_4_;
  fVar158 = auVar40._8_4_;
  fVar159 = auVar40._12_4_;
  fVar156 = (1.0 - auVar121._0_4_ * fVar156) * fVar156 + fVar156;
  fVar157 = (1.0 - auVar121._4_4_ * fVar157) * fVar157 + fVar157;
  fVar158 = (1.0 - auVar121._8_4_ * fVar158) * fVar158 + fVar158;
  fVar159 = (1.0 - auVar121._12_4_ * fVar159) * fVar159 + fVar159;
  auVar40 = rcpps(auVar40,auVar129);
  fVar160 = auVar40._0_4_;
  fVar161 = auVar40._4_4_;
  fVar162 = auVar40._8_4_;
  fVar163 = auVar40._12_4_;
  fVar160 = (1.0 - auVar129._0_4_ * fVar160) * fVar160 + fVar160;
  fVar161 = (1.0 - auVar129._4_4_ * fVar161) * fVar161 + fVar161;
  fVar162 = (1.0 - auVar129._8_4_ * fVar162) * fVar162 + fVar162;
  fVar163 = (1.0 - auVar129._12_4_ * fVar163) * fVar163 + fVar163;
  auVar40 = rcpps(auVar40,auVar136);
  fVar110 = auVar40._0_4_;
  fVar114 = auVar40._4_4_;
  fVar116 = auVar40._8_4_;
  fVar118 = auVar40._12_4_;
  fVar110 = (1.0 - auVar136._0_4_ * fVar110) * fVar110 + fVar110;
  fVar114 = (1.0 - auVar136._4_4_ * fVar114) * fVar114 + fVar114;
  fVar116 = (1.0 - auVar136._8_4_ * fVar116) * fVar116 + fVar116;
  fVar118 = (1.0 - auVar136._12_4_ * fVar118) * fVar118 + fVar118;
  auVar138._0_12_ = ZEXT812(0);
  auVar138._12_4_ = 0;
  auVar40 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar138);
  local_10b8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar138);
  auVar136._0_8_ = CONCAT44(-(uint)(auVar95._4_4_ < 0.0),-(uint)(auVar95._0_4_ < 0.0)) & 0x100000001
  ;
  auVar136._8_4_ = -(uint)(auVar95._8_4_ < 0.0) & 1;
  auVar136._12_4_ = -(uint)(auVar95._12_4_ < 0.0) & 1;
  auVar95._0_8_ =
       CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
       0x200000002;
  auVar95._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
  auVar95._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
  auVar121._0_8_ =
       CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
       0x400000004;
  auVar121._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
  auVar121._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
  local_10c8 = auVar80 ^ (undefined1  [16])ai.field_0 | auVar121 | auVar95 | auVar136;
  local_1058 = fVar142;
  fStack_1054 = fVar143;
  fStack_1050 = fVar144;
  fStack_104c = fVar145;
  local_1068 = fVar146;
  fStack_1064 = fVar147;
  fStack_1060 = fVar148;
  fStack_105c = fVar149;
  local_1078 = fVar150;
  fStack_1074 = fVar151;
  fStack_1070 = fVar152;
  fStack_106c = fVar153;
  local_1088 = fVar110;
  fStack_1084 = fVar114;
  fStack_1080 = fVar116;
  fStack_107c = fVar118;
  local_1098 = fVar156;
  fStack_1094 = fVar157;
  fStack_1090 = fVar158;
  fStack_108c = fVar159;
  local_10a8 = fVar160;
  fStack_10a4 = fVar161;
  fStack_10a0 = fVar162;
  fStack_109c = fVar163;
LAB_002abe05:
  lVar5 = 0;
  if (pSVar31 != (StackItemT<embree::NodeRefPtr<4>_> *)0x0) {
    for (; ((ulong)pSVar31 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  iVar3 = *(int *)(local_10c8 + lVar5 * 4);
  auVar41._0_8_ = CONCAT44(-(uint)(iVar3 == local_10c8._4_4_),-(uint)(iVar3 == local_10c8._0_4_));
  auVar41._8_4_ = -(uint)(iVar3 == local_10c8._8_4_);
  auVar41._12_4_ = -(uint)(iVar3 == local_10c8._12_4_);
  uVar30 = movmskps((int)lVar5,auVar41);
  pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)
            (~CONCAT44((int)((ulong)lVar5 >> 0x20),uVar30) & (ulong)pSVar31);
  auVar14._4_4_ = fVar157;
  auVar14._0_4_ = fVar156;
  auVar14._8_4_ = fVar158;
  auVar14._12_4_ = fVar159;
  auVar80 = blendvps(_DAT_01feb9f0,auVar14,auVar41);
  auVar62._4_4_ = auVar80._0_4_;
  auVar62._0_4_ = auVar80._4_4_;
  auVar62._8_4_ = auVar80._12_4_;
  auVar62._12_4_ = auVar80._8_4_;
  auVar80 = minps(auVar62,auVar80);
  auVar137._0_8_ = auVar80._8_8_;
  auVar137._8_4_ = auVar80._0_4_;
  auVar137._12_4_ = auVar80._4_4_;
  auVar129 = minps(auVar137,auVar80);
  auVar16._4_4_ = fVar161;
  auVar16._0_4_ = fVar160;
  auVar16._8_4_ = fVar162;
  auVar16._12_4_ = fVar163;
  auVar80 = blendvps(_DAT_01feb9f0,auVar16,auVar41);
  auVar63._4_4_ = auVar80._0_4_;
  auVar63._0_4_ = auVar80._4_4_;
  auVar63._8_4_ = auVar80._12_4_;
  auVar63._12_4_ = auVar80._8_4_;
  auVar80 = minps(auVar63,auVar80);
  auVar81._0_8_ = auVar80._8_8_;
  auVar81._8_4_ = auVar80._0_4_;
  auVar81._12_4_ = auVar80._4_4_;
  auVar80 = minps(auVar81,auVar80);
  auVar12._4_4_ = fVar114;
  auVar12._0_4_ = fVar110;
  auVar12._8_4_ = fVar116;
  auVar12._12_4_ = fVar118;
  auVar95 = blendvps(_DAT_01feb9f0,auVar12,auVar41);
  auVar129 = insertps(auVar129,auVar80,0x1c);
  auVar64._4_4_ = auVar95._0_4_;
  auVar64._0_4_ = auVar95._4_4_;
  auVar64._8_4_ = auVar95._12_4_;
  auVar64._12_4_ = auVar95._8_4_;
  auVar80 = minps(auVar64,auVar95);
  auVar82._0_8_ = auVar80._8_8_;
  auVar82._8_4_ = auVar80._0_4_;
  auVar82._12_4_ = auVar80._4_4_;
  auVar80 = minps(auVar82,auVar80);
  auVar138 = insertps(auVar129,auVar80,0x20);
  auVar15._4_4_ = fVar157;
  auVar15._0_4_ = fVar156;
  auVar15._8_4_ = fVar158;
  auVar15._12_4_ = fVar159;
  auVar80 = blendvps(_DAT_01feba00,auVar15,auVar41);
  auVar65._4_4_ = auVar80._0_4_;
  auVar65._0_4_ = auVar80._4_4_;
  auVar65._8_4_ = auVar80._12_4_;
  auVar65._12_4_ = auVar80._8_4_;
  auVar80 = maxps(auVar65,auVar80);
  auVar130._0_8_ = auVar80._8_8_;
  auVar130._8_4_ = auVar80._0_4_;
  auVar130._12_4_ = auVar80._4_4_;
  auVar129 = maxps(auVar130,auVar80);
  auVar66._8_4_ = auVar41._8_4_;
  auVar66._0_8_ = auVar41._0_8_;
  auVar66._12_4_ = auVar41._12_4_;
  auVar17._4_4_ = fVar161;
  auVar17._0_4_ = fVar160;
  auVar17._8_4_ = fVar162;
  auVar17._12_4_ = fVar163;
  auVar80 = blendvps(_DAT_01feba00,auVar17,auVar41);
  auVar42._4_4_ = auVar80._0_4_;
  auVar42._0_4_ = auVar80._4_4_;
  auVar42._8_4_ = auVar80._12_4_;
  auVar42._12_4_ = auVar80._8_4_;
  auVar80 = maxps(auVar42,auVar80);
  auVar83._0_8_ = auVar80._8_8_;
  auVar83._8_4_ = auVar80._0_4_;
  auVar83._12_4_ = auVar80._4_4_;
  auVar80 = maxps(auVar83,auVar80);
  auVar43._8_4_ = auVar41._8_4_;
  auVar43._0_8_ = auVar41._0_8_;
  auVar43._12_4_ = auVar41._12_4_;
  auVar13._4_4_ = fVar114;
  auVar13._0_4_ = fVar110;
  auVar13._8_4_ = fVar116;
  auVar13._12_4_ = fVar118;
  auVar95 = blendvps(_DAT_01feba00,auVar13,auVar43);
  auVar129 = insertps(auVar129,auVar80,0x1c);
  auVar44._4_4_ = auVar95._0_4_;
  auVar44._0_4_ = auVar95._4_4_;
  auVar44._8_4_ = auVar95._12_4_;
  auVar44._12_4_ = auVar95._8_4_;
  auVar80 = maxps(auVar44,auVar95);
  auVar84._0_8_ = auVar80._8_8_;
  auVar84._8_4_ = auVar80._0_4_;
  auVar84._12_4_ = auVar80._4_4_;
  auVar80 = maxps(auVar84,auVar80);
  auVar136 = insertps(auVar129,auVar80,0x20);
  auVar45._4_4_ = -(uint)(0.0 <= auVar138._4_4_);
  auVar45._0_4_ = -(uint)(0.0 <= auVar138._0_4_);
  auVar45._8_4_ = -(uint)(0.0 <= auVar138._8_4_);
  auVar45._12_4_ = -(uint)(0.0 <= auVar138._12_4_);
  auVar80 = blendvps(auVar136,auVar138,auVar45);
  local_fe8 = auVar80._4_4_;
  uVar36 = (ulong)(local_fe8 < 0.0) << 4 | 0x20;
  fStack_f80 = auVar80._8_4_;
  uVar39 = (ulong)(fStack_f80 < 0.0) << 4 | 0x40;
  uVar37 = uVar36 ^ 0x10;
  local_fc8 = auVar80._0_4_;
  auVar46._8_4_ = auVar41._8_4_;
  auVar46._0_8_ = auVar41._0_8_;
  auVar46._12_4_ = auVar41._12_4_;
  auVar6._4_4_ = fVar143;
  auVar6._0_4_ = fVar142;
  auVar6._8_4_ = fVar144;
  auVar6._12_4_ = fVar145;
  auVar80 = blendvps(_DAT_01feb9f0,auVar6,auVar46);
  auVar47._4_4_ = auVar80._0_4_;
  auVar47._0_4_ = auVar80._4_4_;
  auVar47._8_4_ = auVar80._12_4_;
  auVar47._12_4_ = auVar80._8_4_;
  auVar80 = minps(auVar47,auVar80);
  auVar85._0_8_ = auVar80._8_8_;
  auVar85._8_4_ = auVar80._0_4_;
  auVar85._12_4_ = auVar80._4_4_;
  auVar95 = minps(auVar85,auVar80);
  auVar48._8_4_ = auVar41._8_4_;
  auVar48._0_8_ = auVar41._0_8_;
  auVar48._12_4_ = auVar41._12_4_;
  auVar8._4_4_ = fVar147;
  auVar8._0_4_ = fVar146;
  auVar8._8_4_ = fVar148;
  auVar8._12_4_ = fVar149;
  auVar80 = blendvps(_DAT_01feb9f0,auVar8,auVar48);
  auVar49._4_4_ = auVar80._0_4_;
  auVar49._0_4_ = auVar80._4_4_;
  auVar49._8_4_ = auVar80._12_4_;
  auVar49._12_4_ = auVar80._8_4_;
  auVar80 = minps(auVar49,auVar80);
  auVar102._0_8_ = auVar80._8_8_;
  auVar102._8_4_ = auVar80._0_4_;
  auVar102._12_4_ = auVar80._4_4_;
  auVar80 = minps(auVar102,auVar80);
  auVar50._8_4_ = auVar41._8_4_;
  auVar50._0_8_ = auVar41._0_8_;
  auVar50._12_4_ = auVar41._12_4_;
  auVar10._4_4_ = fVar151;
  auVar10._0_4_ = fVar150;
  auVar10._8_4_ = fVar152;
  auVar10._12_4_ = fVar153;
  auVar129 = blendvps(_DAT_01feb9f0,auVar10,auVar50);
  auVar95 = insertps(auVar95,auVar80,0x1c);
  auVar51._4_4_ = auVar129._0_4_;
  auVar51._0_4_ = auVar129._4_4_;
  auVar51._8_4_ = auVar129._12_4_;
  auVar51._12_4_ = auVar129._8_4_;
  auVar80 = minps(auVar51,auVar129);
  auVar103._0_8_ = auVar80._8_8_;
  auVar103._8_4_ = auVar80._0_4_;
  auVar103._12_4_ = auVar80._4_4_;
  auVar80 = minps(auVar103,auVar80);
  auVar95 = insertps(auVar95,auVar80,0x20);
  auVar52._8_4_ = auVar41._8_4_;
  auVar52._0_8_ = auVar41._0_8_;
  auVar52._12_4_ = auVar41._12_4_;
  auVar7._4_4_ = fVar143;
  auVar7._0_4_ = fVar142;
  auVar7._8_4_ = fVar144;
  auVar7._12_4_ = fVar145;
  auVar80 = blendvps(_DAT_01feba00,auVar7,auVar52);
  auVar53._4_4_ = auVar80._0_4_;
  auVar53._0_4_ = auVar80._4_4_;
  auVar53._8_4_ = auVar80._12_4_;
  auVar53._12_4_ = auVar80._8_4_;
  auVar80 = maxps(auVar53,auVar80);
  auVar104._0_8_ = auVar80._8_8_;
  auVar104._8_4_ = auVar80._0_4_;
  auVar104._12_4_ = auVar80._4_4_;
  auVar129 = maxps(auVar104,auVar80);
  auVar54._8_4_ = auVar41._8_4_;
  auVar54._0_8_ = auVar41._0_8_;
  auVar54._12_4_ = auVar41._12_4_;
  auVar9._4_4_ = fVar147;
  auVar9._0_4_ = fVar146;
  auVar9._8_4_ = fVar148;
  auVar9._12_4_ = fVar149;
  auVar80 = blendvps(_DAT_01feba00,auVar9,auVar54);
  auVar55._4_4_ = auVar80._0_4_;
  auVar55._0_4_ = auVar80._4_4_;
  auVar55._8_4_ = auVar80._12_4_;
  auVar55._12_4_ = auVar80._8_4_;
  auVar80 = maxps(auVar55,auVar80);
  auVar112._0_8_ = auVar80._8_8_;
  auVar112._8_4_ = auVar80._0_4_;
  auVar112._12_4_ = auVar80._4_4_;
  auVar80 = maxps(auVar112,auVar80);
  auVar56._8_4_ = auVar41._8_4_;
  auVar56._0_8_ = auVar41._0_8_;
  auVar56._12_4_ = auVar41._12_4_;
  auVar11._4_4_ = fVar151;
  auVar11._0_4_ = fVar150;
  auVar11._8_4_ = fVar152;
  auVar11._12_4_ = fVar153;
  auVar121 = blendvps(_DAT_01feba00,auVar11,auVar56);
  auVar129 = insertps(auVar129,auVar80,0x1c);
  auVar57._4_4_ = auVar121._0_4_;
  auVar57._0_4_ = auVar121._4_4_;
  auVar57._8_4_ = auVar121._12_4_;
  auVar57._12_4_ = auVar121._8_4_;
  auVar80 = maxps(auVar57,auVar121);
  auVar113._0_8_ = auVar80._8_8_;
  auVar113._8_4_ = auVar80._0_4_;
  auVar113._12_4_ = auVar80._4_4_;
  auVar80 = maxps(auVar113,auVar80);
  auVar80 = insertps(auVar129,auVar80,0x20);
  auVar129 = blendvps(auVar80,auVar95,auVar45);
  auVar95 = blendvps(auVar95,auVar80,auVar45);
  auVar58._8_4_ = auVar41._8_4_;
  auVar58._0_8_ = auVar41._0_8_;
  auVar58._12_4_ = auVar41._12_4_;
  bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps(_DAT_01feba00,local_10b8,auVar58);
  auVar105._4_4_ = bi_9.field_0._0_4_;
  auVar105._0_4_ = bi_9.field_0._4_4_;
  auVar105._8_4_ = bi_9.field_0._12_4_;
  auVar105._12_4_ = bi_9.field_0._8_4_;
  auVar106 = maxps(auVar105,(undefined1  [16])bi_9.field_0);
  auVar18._4_8_ = auVar121._8_8_;
  auVar18._0_4_ = auVar106._4_4_;
  auVar122._0_8_ = auVar18._0_8_ << 0x20;
  auVar122._8_4_ = auVar106._8_4_;
  auVar122._12_4_ = auVar106._12_4_;
  auVar123._8_8_ = auVar106._8_8_;
  auVar123._0_8_ = auVar122._8_8_;
  auVar80 = blendvps(_DAT_01feb9f0,auVar40,auVar58);
  auVar67._4_4_ = auVar80._0_4_;
  auVar67._0_4_ = auVar80._4_4_;
  auVar67._8_4_ = auVar80._12_4_;
  auVar67._12_4_ = auVar80._8_4_;
  auVar80 = minps(auVar67,auVar80);
  if (auVar106._8_4_ <= auVar106._0_4_) {
    auVar123._0_4_ = auVar106._0_4_;
  }
  auVar106 = blendvps(auVar138,auVar136,auVar45);
  local_fd8 = auVar95._0_4_ * local_fc8;
  local_ff8 = auVar95._4_4_ * local_fe8;
  fStack_f90 = auVar95._8_4_ * fStack_f80;
  local_1008 = auVar106._0_4_;
  local_1018 = auVar129._0_4_ * local_1008;
  local_1028 = auVar106._4_4_;
  fVar97 = auVar129._4_4_ * local_1028;
  fStack_1144 = auVar106._8_4_;
  fStack_fa0 = auVar129._8_4_ * fStack_1144;
  uVar29 = (ulong)(local_fc8 < 0.0) * 0x10;
  uVar25 = *(ulong *)&pAVar4[1].bounds.bounds0.lower.field_0;
  stack[0].ptr.ptr = uVar25;
  stack[0].dist = 0;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  local_f88._4_4_ = fStack_f80;
  local_f88._0_4_ = fStack_f80;
  fStack_f7c = fStack_f80;
  local_f98._4_4_ = fStack_f90;
  local_f98._0_4_ = fStack_f90;
  fStack_f8c = fStack_f90;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  uVar30 = auVar80._0_4_;
  auVar68._8_4_ = auVar80._8_4_;
  auVar59._4_4_ = uVar30;
  auVar59._0_4_ = uVar30;
  auVar59._8_4_ = uVar30;
  auVar59._12_4_ = uVar30;
  auVar68._4_4_ = auVar68._8_4_;
  auVar68._0_4_ = auVar68._8_4_;
  auVar68._12_4_ = auVar68._8_4_;
  local_fb8 = minps(auVar68,auVar59);
  auVar80 = blendvps(_DAT_01feb9f0,auVar40,auVar66);
  local_1038._4_4_ = fVar97;
  local_1038._0_4_ = fVar97;
  fStack_1030 = fVar97;
  fStack_102c = fVar97;
  local_1148 = fStack_1144;
  fStack_1140 = fStack_1144;
  fStack_113c = fStack_1144;
  local_fa8._4_4_ = fStack_fa0;
  local_fa8._0_4_ = fStack_fa0;
  fStack_f9c = fStack_fa0;
  pSVar38 = stack + 1;
  local_1198.context = (RTCRayQueryContext *)pSVar31;
  do {
    auVar124._0_4_ = auVar123._0_4_;
    auVar124._4_4_ = auVar124._0_4_;
    auVar124._8_4_ = auVar124._0_4_;
    auVar124._12_4_ = auVar124._0_4_;
    local_1138 = auVar124;
LAB_002ac1e9:
    do {
      do {
        if (pSVar38 == stack) {
          if (pSVar31 == (StackItemT<embree::NodeRefPtr<4>_> *)0x0) {
            return;
          }
          goto LAB_002abe05;
        }
        fVar97 = (float)pSVar38[-1].dist;
        pSVar38 = pSVar38 + -1;
        auVar154._4_4_ = fVar97;
        auVar154._0_4_ = fVar97;
        auVar154._8_4_ = fVar97;
        auVar154._12_4_ = fVar97;
        auVar69._4_4_ = -(uint)(fVar97 < (float)bi_9.field_0.i[1]);
        auVar69._0_4_ = -(uint)(fVar97 < (float)bi_9.field_0.i[0]);
        auVar69._8_4_ = -(uint)(fVar97 < (float)bi_9.field_0.i[2]);
        auVar69._12_4_ = -(uint)(fVar97 < (float)bi_9.field_0.i[3]);
        uVar24 = movmskps((int)uVar25,auVar69);
        uVar25 = (ulong)uVar24;
      } while (uVar24 == 0);
      sVar35 = (pSVar38->ptr).ptr;
      while ((sVar35 & 8) == 0) {
        pfVar2 = (float *)(sVar35 + 0x20 + uVar29);
        fVar97 = *pfVar2 * local_fc8 - local_fd8;
        fVar72 = pfVar2[1] * fStack_fc4 - fStack_fd4;
        fVar74 = pfVar2[2] * fStack_fc0 - fStack_fd0;
        fVar76 = pfVar2[3] * fStack_fbc - fStack_fcc;
        pfVar2 = (float *)(sVar35 + 0x20 + uVar36);
        fVar78 = *pfVar2 * local_fe8 - local_ff8;
        fVar87 = pfVar2[1] * fStack_fe4 - fStack_ff4;
        fVar89 = pfVar2[2] * fStack_fe0 - fStack_ff0;
        fVar91 = pfVar2[3] * fStack_fdc - fStack_fec;
        uVar79 = (uint)((int)fVar78 < (int)fVar97) * (int)fVar97 |
                 (uint)((int)fVar78 >= (int)fVar97) * (int)fVar78;
        uVar88 = (uint)((int)fVar87 < (int)fVar72) * (int)fVar72 |
                 (uint)((int)fVar87 >= (int)fVar72) * (int)fVar87;
        uVar90 = (uint)((int)fVar89 < (int)fVar74) * (int)fVar74 |
                 (uint)((int)fVar89 >= (int)fVar74) * (int)fVar89;
        uVar92 = (uint)((int)fVar91 < (int)fVar76) * (int)fVar76 |
                 (uint)((int)fVar91 >= (int)fVar76) * (int)fVar91;
        pfVar2 = (float *)(sVar35 + 0x20 + uVar39);
        fVar97 = *pfVar2 * (float)local_f88._0_4_ - (float)local_f98._0_4_;
        fVar72 = pfVar2[1] * (float)local_f88._4_4_ - (float)local_f98._4_4_;
        fVar74 = pfVar2[2] * fStack_f80 - fStack_f90;
        fVar76 = pfVar2[3] * fStack_f7c - fStack_f8c;
        uVar24 = (uint)((int)fVar97 < (int)local_fb8._0_4_) * local_fb8._0_4_ |
                 (uint)((int)fVar97 >= (int)local_fb8._0_4_) * (int)fVar97;
        uVar73 = (uint)((int)fVar72 < (int)local_fb8._4_4_) * local_fb8._4_4_ |
                 (uint)((int)fVar72 >= (int)local_fb8._4_4_) * (int)fVar72;
        uVar75 = (uint)((int)fVar74 < (int)local_fb8._8_4_) * local_fb8._8_4_ |
                 (uint)((int)fVar74 >= (int)local_fb8._8_4_) * (int)fVar74;
        uVar77 = (uint)((int)fVar76 < (int)local_fb8._12_4_) * local_fb8._12_4_ |
                 (uint)((int)fVar76 >= (int)local_fb8._12_4_) * (int)fVar76;
        fmin.field_0.i[0] =
             ((int)uVar24 < (int)uVar79) * uVar79 | ((int)uVar24 >= (int)uVar79) * uVar24;
        fmin.field_0.i[1] =
             ((int)uVar73 < (int)uVar88) * uVar88 | ((int)uVar73 >= (int)uVar88) * uVar73;
        fmin.field_0.i[2] =
             ((int)uVar75 < (int)uVar90) * uVar90 | ((int)uVar75 >= (int)uVar90) * uVar75;
        fmin.field_0.i[3] =
             ((int)uVar77 < (int)uVar92) * uVar92 | ((int)uVar77 >= (int)uVar92) * uVar77;
        pfVar2 = (float *)(sVar35 + 0x20 + (uVar29 ^ 0x10));
        fVar97 = *pfVar2 * local_1008 - local_1018;
        fVar72 = pfVar2[1] * fStack_1004 - fStack_1014;
        fVar74 = pfVar2[2] * fStack_1000 - fStack_1010;
        fVar76 = pfVar2[3] * fStack_ffc - fStack_100c;
        pfVar2 = (float *)(sVar35 + 0x20 + uVar37);
        fVar78 = *pfVar2 * local_1028 - (float)local_1038._0_4_;
        fVar87 = pfVar2[1] * fStack_1024 - (float)local_1038._4_4_;
        fVar89 = pfVar2[2] * fStack_1020 - fStack_1030;
        fVar91 = pfVar2[3] * fStack_101c - fStack_102c;
        uVar79 = (uint)((int)fVar97 < (int)fVar78) * (int)fVar97 |
                 (uint)((int)fVar97 >= (int)fVar78) * (int)fVar78;
        uVar88 = (uint)((int)fVar72 < (int)fVar87) * (int)fVar72 |
                 (uint)((int)fVar72 >= (int)fVar87) * (int)fVar87;
        uVar90 = (uint)((int)fVar74 < (int)fVar89) * (int)fVar74 |
                 (uint)((int)fVar74 >= (int)fVar89) * (int)fVar89;
        uVar92 = (uint)((int)fVar76 < (int)fVar91) * (int)fVar76 |
                 (uint)((int)fVar76 >= (int)fVar91) * (int)fVar91;
        pfVar2 = (float *)(sVar35 + 0x20 + (uVar39 ^ 0x10));
        fVar97 = *pfVar2 * local_1148 - (float)local_fa8._0_4_;
        fVar72 = pfVar2[1] * fStack_1144 - (float)local_fa8._4_4_;
        fVar74 = pfVar2[2] * fStack_1140 - fStack_fa0;
        fVar76 = pfVar2[3] * fStack_113c - fStack_f9c;
        uVar24 = (uint)((int)local_1138._0_4_ < (int)fVar97) * local_1138._0_4_ |
                 (uint)((int)local_1138._0_4_ >= (int)fVar97) * (int)fVar97;
        uVar73 = (uint)((int)local_1138._4_4_ < (int)fVar72) * local_1138._4_4_ |
                 (uint)((int)local_1138._4_4_ >= (int)fVar72) * (int)fVar72;
        uVar75 = (uint)((int)local_1138._8_4_ < (int)fVar74) * local_1138._8_4_ |
                 (uint)((int)local_1138._8_4_ >= (int)fVar74) * (int)fVar74;
        uVar77 = (uint)((int)local_1138._12_4_ < (int)fVar76) * local_1138._12_4_ |
                 (uint)((int)local_1138._12_4_ >= (int)fVar76) * (int)fVar76;
        auVar70._4_4_ =
             -(uint)(fmin.field_0.v[1] <=
                    (float)(((int)uVar88 < (int)uVar73) * uVar88 |
                           ((int)uVar88 >= (int)uVar73) * uVar73));
        auVar70._0_4_ =
             -(uint)(fmin.field_0.v[0] <=
                    (float)(((int)uVar79 < (int)uVar24) * uVar79 |
                           ((int)uVar79 >= (int)uVar24) * uVar24));
        auVar70._8_4_ =
             -(uint)(fmin.field_0.v[2] <=
                    (float)(((int)uVar90 < (int)uVar75) * uVar90 |
                           ((int)uVar90 >= (int)uVar75) * uVar75));
        auVar70._12_4_ =
             -(uint)(fmin.field_0.v[3] <=
                    (float)(((int)uVar92 < (int)uVar77) * uVar92 |
                           ((int)uVar92 >= (int)uVar77) * uVar77));
        uVar24 = movmskps((int)uVar37,auVar70);
        uVar25 = (ulong)uVar24;
        if (uVar24 == 0) {
          bVar23 = false;
        }
        else {
          uVar32 = (ulong)(byte)uVar24;
          uVar34 = 0;
          uVar26 = 8;
          auVar154 = _DAT_01feb9f0;
          do {
            lVar5 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            fVar97 = *(float *)(sVar35 + 0x20 + lVar5 * 4);
            fVar72 = *(float *)(sVar35 + 0x30 + lVar5 * 4);
            fVar74 = *(float *)(sVar35 + 0x40 + lVar5 * 4);
            fVar76 = *(float *)(sVar35 + 0x50 + lVar5 * 4);
            fVar94 = (fVar97 - fVar142) * fVar156;
            fVar98 = (fVar97 - fVar143) * fVar157;
            fVar99 = (fVar97 - fVar144) * fVar158;
            fVar100 = (fVar97 - fVar145) * fVar159;
            fVar101 = (fVar74 - fVar146) * fVar160;
            fVar107 = (fVar74 - fVar147) * fVar161;
            fVar108 = (fVar74 - fVar148) * fVar162;
            fVar109 = (fVar74 - fVar149) * fVar163;
            fVar97 = *(float *)(sVar35 + 0x60 + lVar5 * 4);
            fVar111 = (fVar97 - fVar150) * fVar110;
            fVar115 = (fVar97 - fVar151) * fVar114;
            fVar117 = (fVar97 - fVar152) * fVar116;
            fVar119 = (fVar97 - fVar153) * fVar118;
            fVar87 = (fVar72 - fVar142) * fVar156;
            fVar89 = (fVar72 - fVar143) * fVar157;
            fVar91 = (fVar72 - fVar144) * fVar158;
            fVar93 = (fVar72 - fVar145) * fVar159;
            fVar72 = (fVar76 - fVar146) * fVar160;
            fVar74 = (fVar76 - fVar147) * fVar161;
            fVar78 = (fVar76 - fVar148) * fVar162;
            fVar76 = (fVar76 - fVar149) * fVar163;
            fVar97 = *(float *)(sVar35 + 0x70 + lVar5 * 4);
            fVar120 = (fVar97 - fVar150) * fVar110;
            fVar126 = (fVar97 - fVar151) * fVar114;
            fVar127 = (fVar97 - fVar152) * fVar116;
            fVar97 = (fVar97 - fVar153) * fVar118;
            uVar24 = (uint)((int)fVar87 < (int)fVar94) * (int)fVar87 |
                     (uint)((int)fVar87 >= (int)fVar94) * (int)fVar94;
            uVar73 = (uint)((int)fVar89 < (int)fVar98) * (int)fVar89 |
                     (uint)((int)fVar89 >= (int)fVar98) * (int)fVar98;
            uVar75 = (uint)((int)fVar91 < (int)fVar99) * (int)fVar91 |
                     (uint)((int)fVar91 >= (int)fVar99) * (int)fVar99;
            uVar77 = (uint)((int)fVar93 < (int)fVar100) * (int)fVar93 |
                     (uint)((int)fVar93 >= (int)fVar100) * (int)fVar100;
            uVar79 = (uint)((int)fVar72 < (int)fVar101) * (int)fVar72 |
                     (uint)((int)fVar72 >= (int)fVar101) * (int)fVar101;
            uVar88 = (uint)((int)fVar74 < (int)fVar107) * (int)fVar74 |
                     (uint)((int)fVar74 >= (int)fVar107) * (int)fVar107;
            uVar90 = (uint)((int)fVar78 < (int)fVar108) * (int)fVar78 |
                     (uint)((int)fVar78 >= (int)fVar108) * (int)fVar108;
            uVar92 = (uint)((int)fVar76 < (int)fVar109) * (int)fVar76 |
                     (uint)((int)fVar76 >= (int)fVar109) * (int)fVar109;
            uVar135 = ((int)uVar79 < (int)uVar24) * uVar24 | ((int)uVar79 >= (int)uVar24) * uVar79;
            uVar139 = ((int)uVar88 < (int)uVar73) * uVar73 | ((int)uVar88 >= (int)uVar73) * uVar88;
            uVar140 = ((int)uVar90 < (int)uVar75) * uVar75 | ((int)uVar90 >= (int)uVar75) * uVar90;
            uVar141 = ((int)uVar92 < (int)uVar77) * uVar77 | ((int)uVar92 >= (int)uVar77) * uVar92;
            uVar24 = (uint)((int)fVar120 < (int)fVar111) * (int)fVar120 |
                     (uint)((int)fVar120 >= (int)fVar111) * (int)fVar111;
            uVar73 = (uint)((int)fVar126 < (int)fVar115) * (int)fVar126 |
                     (uint)((int)fVar126 >= (int)fVar115) * (int)fVar115;
            uVar75 = (uint)((int)fVar127 < (int)fVar117) * (int)fVar127 |
                     (uint)((int)fVar127 >= (int)fVar117) * (int)fVar117;
            uVar77 = (uint)((int)fVar97 < (int)fVar119) * (int)fVar97 |
                     (uint)((int)fVar97 >= (int)fVar119) * (int)fVar119;
            local_11a8 = auVar80._0_4_;
            iStack_11a4 = auVar80._4_4_;
            iStack_11a0 = auVar80._8_4_;
            iStack_119c = auVar80._12_4_;
            uVar128 = (uint)((int)uVar24 < local_11a8) * local_11a8 |
                      ((int)uVar24 >= local_11a8) * uVar24;
            uVar132 = (uint)((int)uVar73 < iStack_11a4) * iStack_11a4 |
                      ((int)uVar73 >= iStack_11a4) * uVar73;
            uVar133 = (uint)((int)uVar75 < iStack_11a0) * iStack_11a0 |
                      ((int)uVar75 >= iStack_11a0) * uVar75;
            uVar134 = (uint)((int)uVar77 < iStack_119c) * iStack_119c |
                      ((int)uVar77 >= iStack_119c) * uVar77;
            uVar79 = (uint)((int)fVar87 < (int)fVar94) * (int)fVar94 |
                     (uint)((int)fVar87 >= (int)fVar94) * (int)fVar87;
            uVar88 = (uint)((int)fVar89 < (int)fVar98) * (int)fVar98 |
                     (uint)((int)fVar89 >= (int)fVar98) * (int)fVar89;
            uVar90 = (uint)((int)fVar91 < (int)fVar99) * (int)fVar99 |
                     (uint)((int)fVar91 >= (int)fVar99) * (int)fVar91;
            uVar92 = (uint)((int)fVar93 < (int)fVar100) * (int)fVar100 |
                     (uint)((int)fVar93 >= (int)fVar100) * (int)fVar93;
            uVar24 = (uint)((int)fVar72 < (int)fVar101) * (int)fVar101 |
                     (uint)((int)fVar72 >= (int)fVar101) * (int)fVar72;
            uVar73 = (uint)((int)fVar74 < (int)fVar107) * (int)fVar107 |
                     (uint)((int)fVar74 >= (int)fVar107) * (int)fVar74;
            uVar75 = (uint)((int)fVar78 < (int)fVar108) * (int)fVar108 |
                     (uint)((int)fVar78 >= (int)fVar108) * (int)fVar78;
            uVar77 = (uint)((int)fVar76 < (int)fVar109) * (int)fVar109 |
                     (uint)((int)fVar76 >= (int)fVar109) * (int)fVar76;
            uVar24 = ((int)uVar79 < (int)uVar24) * uVar79 | ((int)uVar79 >= (int)uVar24) * uVar24;
            uVar73 = ((int)uVar88 < (int)uVar73) * uVar88 | ((int)uVar88 >= (int)uVar73) * uVar73;
            uVar75 = ((int)uVar90 < (int)uVar75) * uVar90 | ((int)uVar90 >= (int)uVar75) * uVar75;
            uVar77 = ((int)uVar92 < (int)uVar77) * uVar92 | ((int)uVar92 >= (int)uVar77) * uVar77;
            uVar79 = (uint)((int)fVar120 < (int)fVar111) * (int)fVar111 |
                     (uint)((int)fVar120 >= (int)fVar111) * (int)fVar120;
            uVar88 = (uint)((int)fVar126 < (int)fVar115) * (int)fVar115 |
                     (uint)((int)fVar126 >= (int)fVar115) * (int)fVar126;
            uVar90 = (uint)((int)fVar127 < (int)fVar117) * (int)fVar117 |
                     (uint)((int)fVar127 >= (int)fVar117) * (int)fVar127;
            uVar92 = (uint)((int)fVar97 < (int)fVar119) * (int)fVar119 |
                     (uint)((int)fVar97 >= (int)fVar119) * (int)fVar97;
            uVar79 = (uint)(bi_9.field_0.i[0] < (int)uVar79) * bi_9.field_0.i[0] |
                     (bi_9.field_0.i[0] >= (int)uVar79) * uVar79;
            uVar88 = (uint)(bi_9.field_0.i[1] < (int)uVar88) * bi_9.field_0.i[1] |
                     (bi_9.field_0.i[1] >= (int)uVar88) * uVar88;
            uVar90 = (uint)(bi_9.field_0.i[2] < (int)uVar90) * bi_9.field_0.i[2] |
                     (bi_9.field_0.i[2] >= (int)uVar90) * uVar90;
            uVar92 = (uint)(bi_9.field_0.i[3] < (int)uVar92) * bi_9.field_0.i[3] |
                     (bi_9.field_0.i[3] >= (int)uVar92) * uVar92;
            auVar124._0_4_ =
                 (float)(((int)uVar24 < (int)uVar79) * uVar24 |
                        ((int)uVar24 >= (int)uVar79) * uVar79);
            auVar124._4_4_ =
                 (float)(((int)uVar73 < (int)uVar88) * uVar73 |
                        ((int)uVar73 >= (int)uVar88) * uVar88);
            auVar124._8_4_ =
                 (float)(((int)uVar75 < (int)uVar90) * uVar75 |
                        ((int)uVar75 >= (int)uVar90) * uVar90);
            auVar124._12_4_ =
                 (float)(((int)uVar77 < (int)uVar92) * uVar77 |
                        ((int)uVar77 >= (int)uVar92) * uVar92);
            auVar131._4_4_ =
                 -(uint)((float)(((int)uVar132 < (int)uVar139) * uVar139 |
                                ((int)uVar132 >= (int)uVar139) * uVar132) <= auVar124._4_4_);
            auVar131._0_4_ =
                 -(uint)((float)(((int)uVar128 < (int)uVar135) * uVar135 |
                                ((int)uVar128 >= (int)uVar135) * uVar128) <= auVar124._0_4_);
            auVar131._8_4_ =
                 -(uint)((float)(((int)uVar133 < (int)uVar140) * uVar140 |
                                ((int)uVar133 >= (int)uVar140) * uVar133) <= auVar124._8_4_);
            auVar131._12_4_ =
                 -(uint)((float)(((int)uVar134 < (int)uVar141) * uVar141 |
                                ((int)uVar134 >= (int)uVar141) * uVar134) <= auVar124._12_4_);
            uVar24 = movmskps((int)valid_i,auVar131);
            valid_i = (vint<4> *)(ulong)uVar24;
            uVar25 = uVar26;
            if (uVar24 != 0) {
              fVar97 = fmin.field_0.v[lVar5];
              auVar95 = ZEXT416((uint)fVar97);
              uVar25 = *(ulong *)(sVar35 + lVar5 * 8);
              auVar96._4_4_ = -(uint)(fVar97 < auVar154._4_4_);
              auVar96._0_4_ = -(uint)(fVar97 < auVar154._0_4_);
              auVar96._8_4_ = -(uint)(fVar97 < auVar154._8_4_);
              auVar96._12_4_ = -(uint)(fVar97 < auVar154._12_4_);
              uVar24 = movmskps(uVar24,auVar96);
              valid_i = (vint<4> *)(ulong)uVar24;
              if (uVar24 == 0) {
                (pSVar38->ptr).ptr = uVar25;
                uVar25 = uVar26;
              }
              else {
                if (uVar26 == 8) {
                  auVar154._8_4_ = fVar97;
                  auVar154._0_8_ = CONCAT44(fVar97,fVar97);
                  auVar154._12_4_ = fVar97;
                  goto LAB_002ac41e;
                }
                (pSVar38->ptr).ptr = uVar26;
                auVar155._8_4_ = fVar97;
                auVar155._0_8_ = CONCAT44(fVar97,fVar97);
                auVar155._12_4_ = fVar97;
                auVar95 = auVar154;
                auVar154 = auVar155;
              }
              uVar34 = uVar34 + 1;
              pSVar38->dist = auVar95._0_4_;
              pSVar38 = pSVar38 + 1;
            }
LAB_002ac41e:
            local_1198.context = (RTCRayQueryContext *)(uVar32 - 1);
            uVar32 = uVar32 & (ulong)local_1198.context;
            uVar26 = uVar25;
          } while (uVar32 != 0);
          sVar35 = uVar25;
          if (uVar25 == 8) {
            bVar23 = false;
          }
          else {
            bVar23 = true;
            if (1 < uVar34) {
              local_1198.context = (RTCRayQueryContext *)(pSVar38 + -2);
              valid_i = (vint<4> *)(pSVar38 + -1);
              if (pSVar38[-2].dist < pSVar38[-1].dist) {
                piVar20 = (int *)(((StackItemT<embree::NodeRefPtr<4>_> *)local_1198.context)->ptr).
                                 ptr;
                uVar21 = *(undefined8 *)&pSVar38[-2].dist;
                pSVar38[-2].dist = pSVar38[-1].dist;
                (((StackItemT<embree::NodeRefPtr<4>_> *)local_1198.context)->ptr).ptr =
                     (size_t)((RTCIntersectFunctionNArguments *)valid_i)->valid;
                ((RTCIntersectFunctionNArguments *)valid_i)->valid = piVar20;
                local_1198.geometryUserPtr._0_4_ = (uint)uVar21;
                pSVar38[-1].dist = (uint)local_1198.geometryUserPtr;
              }
              if (uVar34 != 2) {
                pSVar1 = pSVar38 + -3;
                if (pSVar38[-3].dist < pSVar38[-1].dist) {
                  piVar20 = (int *)(pSVar1->ptr).ptr;
                  uVar21 = *(undefined8 *)&pSVar38[-3].dist;
                  pSVar38[-3].dist = pSVar38[-1].dist;
                  (pSVar1->ptr).ptr = (size_t)((RTCIntersectFunctionNArguments *)valid_i)->valid;
                  ((RTCIntersectFunctionNArguments *)valid_i)->valid = piVar20;
                  local_1198.geometryUserPtr._0_4_ = (uint)uVar21;
                  pSVar38[-1].dist = (uint)local_1198.geometryUserPtr;
                }
                valid_i = (vint<4> *)(ulong)pSVar38[-3].dist;
                if (pSVar38[-3].dist < pSVar38[-2].dist) {
                  sVar22 = (pSVar1->ptr).ptr;
                  uVar26 = *(ulong *)&pSVar38[-3].dist;
                  pSVar38[-3].dist = pSVar38[-2].dist;
                  (pSVar1->ptr).ptr =
                       (((StackItemT<embree::NodeRefPtr<4>_> *)local_1198.context)->ptr).ptr;
                  (((StackItemT<embree::NodeRefPtr<4>_> *)local_1198.context)->ptr).ptr = sVar22;
                  local_1198.geometryUserPtr._0_4_ = (uint)uVar26;
                  valid_i = (vint<4> *)(uVar26 & 0xffffffff);
                  pSVar38[-2].dist = (uint)local_1198.geometryUserPtr;
                }
              }
            }
          }
        }
        if (!bVar23) goto LAB_002ac1e9;
      }
      auVar60._4_4_ = -(uint)(auVar154._4_4_ < (float)bi_9.field_0.i[1]);
      auVar60._0_4_ = -(uint)(auVar154._0_4_ < (float)bi_9.field_0.i[0]);
      auVar60._8_4_ = -(uint)(auVar154._8_4_ < (float)bi_9.field_0.i[2]);
      auVar60._12_4_ = -(uint)(auVar154._12_4_ < (float)bi_9.field_0.i[3]);
      uVar24 = movmskps((int)uVar25,auVar60);
      uVar25 = (ulong)uVar24;
      if (uVar24 == 0) goto LAB_002ac1e9;
      pGVar27 = (Geometry *)((ulong)((uint)sVar35 & 0xf) - 8);
      local_1168 = pGVar27;
      if (pGVar27 != (Geometry *)0x0) {
        pGVar33 = (Geometry *)0x0;
        local_1048 = auVar60;
        do {
          local_1198.geomID = *(uint *)((sVar35 & 0xfffffffffffffff0) + (long)pGVar33 * 8);
          valid_i = (vint<4> *)(ulong)local_1198.geomID;
          local_1168 = (context->scene->geometries).items[(long)valid_i].ptr;
          uVar24 = local_1168->mask;
          auVar71._0_4_ = -(uint)((uVar24 & *(uint *)(ray + 0x90)) == 0);
          auVar71._4_4_ = -(uint)((uVar24 & *(uint *)(ray + 0x94)) == 0);
          auVar71._8_4_ = -(uint)((uVar24 & *(uint *)(ray + 0x98)) == 0);
          auVar71._12_4_ = -(uint)((uVar24 & *(uint *)(ray + 0x9c)) == 0);
          fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(~auVar71 & auVar60);
          uVar24 = movmskps((int)local_1198.context,(undefined1  [16])fmin.field_0);
          local_1198.context = (RTCRayQueryContext *)(ulong)uVar24;
          if (uVar24 != 0) {
            local_1198.primID = *(uint *)((sVar35 & 0xfffffffffffffff0) + 4 + (long)pGVar33 * 8);
            local_1198.valid = (int *)&fmin;
            local_1198.geometryUserPtr = local_1168->userPtr;
            local_1198.context = context->user;
            local_1198.N = 4;
            local_1160 = 0;
            local_1158 = context->args;
            pp_Var28 = (_func_int **)local_1158->intersect;
            if (pp_Var28 == (_func_int **)0x0) {
              pp_Var28 = local_1168[1].super_RefCount._vptr_RefCount;
            }
            valid_i = (vint<4> *)&local_1198;
            local_1198.rayhit = (RTCRayHitN *)ray;
            local_1168 = (Geometry *)(*(code *)pp_Var28)((RTCIntersectFunctionNArguments *)valid_i);
            auVar60 = local_1048;
            fVar142 = local_1058;
            fVar143 = fStack_1054;
            fVar144 = fStack_1050;
            fVar145 = fStack_104c;
            fVar146 = local_1068;
            fVar147 = fStack_1064;
            fVar148 = fStack_1060;
            fVar149 = fStack_105c;
            fVar150 = local_1078;
            fVar151 = fStack_1074;
            fVar152 = fStack_1070;
            fVar153 = fStack_106c;
            fVar110 = local_1088;
            fVar114 = fStack_1084;
            fVar116 = fStack_1080;
            fVar118 = fStack_107c;
            fVar156 = local_1098;
            fVar157 = fStack_1094;
            fVar158 = fStack_1090;
            fVar159 = fStack_108c;
            fVar160 = local_10a8;
            fVar161 = fStack_10a4;
            fVar162 = fStack_10a0;
            fVar163 = fStack_109c;
          }
          pGVar33 = (Geometry *)((long)&(pGVar33->super_RefCount)._vptr_RefCount + 1);
        } while (pGVar27 != pGVar33);
      }
      auVar95 = *(undefined1 (*) [16])(ray + 0x80);
      auVar86._0_4_ = -(uint)(auVar95._0_4_ < (float)bi_9.field_0.i[0]) & auVar60._0_4_;
      auVar86._4_4_ = -(uint)(auVar95._4_4_ < (float)bi_9.field_0.i[1]) & auVar60._4_4_;
      auVar86._8_4_ = -(uint)(auVar95._8_4_ < (float)bi_9.field_0.i[2]) & auVar60._8_4_;
      auVar86._12_4_ = -(uint)(auVar95._12_4_ < (float)bi_9.field_0.i[3]) & auVar60._12_4_;
      uVar24 = movmskps((int)local_1168,auVar86);
      uVar25 = (ulong)uVar24;
    } while (uVar24 == 0);
    bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   blendvps((undefined1  [16])bi_9.field_0,auVar95,auVar60);
    auVar61._4_4_ = bi_9.field_0._0_4_;
    auVar61._0_4_ = bi_9.field_0._4_4_;
    auVar61._8_4_ = bi_9.field_0._12_4_;
    auVar61._12_4_ = bi_9.field_0._8_4_;
    auVar95 = maxps(auVar61,(undefined1  [16])bi_9.field_0);
    auVar19._4_8_ = auVar124._8_8_;
    auVar19._0_4_ = auVar95._4_4_;
    auVar125._0_8_ = auVar19._0_8_ << 0x20;
    auVar125._8_4_ = auVar95._8_4_;
    auVar125._12_4_ = auVar95._12_4_;
    auVar123._8_8_ = auVar95._8_8_;
    auVar123._0_8_ = auVar125._8_8_;
    if (auVar95._8_4_ <= auVar95._0_4_) {
      auVar123._0_4_ = auVar95._0_4_;
    }
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }